

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

Scroll * __thiscall tli_window_manager::Scroll::operator=(Scroll *this,Scroll *other)

{
  swap(this,other);
  return this;
}

Assistant:

Scroll &Scroll::operator=(Scroll other) noexcept {
    swap(*this, other);
    return *this;
}